

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# body_centered_cubic.hpp
# Opt level: O3

vector __thiscall
sisl::body_centered_cubic<char>::get_natural_scales(body_centered_cubic<char> *this)

{
  long lVar1;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *this_00;
  Index extraout_RDX;
  long in_RSI;
  vector vVar2;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_38;
  
  (this->super_base_lattice<char>)._vptr_base_lattice = (_func_int **)0x0;
  this->_nx = 0;
  this->_ny = 0;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
            ((DenseStorage<double,__1,__1,_1,_0> *)this,3,3,1);
  local_38.m_row = 0;
  local_38.m_col = 1;
  local_38.m_currentBlockRows = 1;
  lVar1._0_4_ = this->_nx;
  lVar1._4_4_ = this->_ny;
  local_38.m_xpr = (Matrix<double,__1,_1,_0,__1,_1> *)this;
  if (lVar1 < 1) {
    __assert_fail("m_xpr.rows() > 0 && m_xpr.cols() > 0 && \"Cannot comma-initialize a 0x0 matrix (operator<<)\""
                  ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x25,
                  "Eigen::CommaInitializer<Eigen::Matrix<double, -1, 1>>::CommaInitializer(XprType &, const Scalar &) [MatrixType = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  *(this->super_base_lattice<char>)._vptr_base_lattice = *(_func_int **)(in_RSI + 0x20);
  this_00 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                      (&local_38,(Scalar *)(in_RSI + 0x28));
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
            (this_00,(Scalar *)(in_RSI + 0x30));
  if ((local_38.m_currentBlockRows + local_38.m_row == *(long *)((long)local_38.m_xpr + 8)) &&
     (local_38.m_col == 1)) {
    vVar2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         extraout_RDX;
    vVar2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)this;
    return (vector)vVar2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
  }
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, -1, 1>>::finished() [MatrixType = Eigen::Matrix<double, -1, 1>]"
               );
}

Assistant:

virtual const vector get_natural_scales() const {
            vector scales(3);
            scales << _sx, _sy, _sz;
            return scales;
        }